

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionCube.hpp
# Opt level: O2

void __thiscall
beagle::cpu::EigenDecompositionCube<float,_1>::updateTransitionMatricesWithModelCategories
          (EigenDecompositionCube<float,_1> *this,int *eigenIndices,int *probabilityIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,double *edgeLengths,
          float **transitionMatrices,int count)

{
  float fVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  float *pfVar13;
  int i;
  long lVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  float *pfVar18;
  int l_1;
  int l;
  int iVar19;
  double dVar20;
  undefined1 auVar21 [16];
  float sumD1;
  undefined1 auVar22 [16];
  float sumD2;
  undefined1 auVar23 [16];
  
  uVar11 = (this->super_EigenDecomposition<float,_1>).kStateCount;
  uVar12 = (ulong)uVar11;
  if (firstDerivativeIndices == (int *)0x0 && secondDerivativeIndices == (int *)0x0) {
    for (uVar9 = 0; uVar9 != (uint)(~(count >> 0x1f) & count); uVar9 = uVar9 + 1) {
      iVar19 = 0;
      pfVar2 = transitionMatrices[probabilityIndices[uVar9]];
      for (lVar8 = 0; lVar8 < (this->super_EigenDecomposition<float,_1>).kCategoryCount;
          lVar8 = lVar8 + 1) {
        lVar14 = 0;
        while( true ) {
          uVar7 = (uint)uVar12;
          lVar5 = (long)(int)uVar7;
          if (lVar5 <= lVar14) break;
          dVar20 = exp((double)((float)edgeLengths[uVar9] *
                               (this->super_EigenDecomposition<float,_1>).gEigenValues
                               [eigenIndices[lVar8]][lVar14]));
          (this->super_EigenDecomposition<float,_1>).matrixTmp[lVar14] = (float)dVar20;
          lVar14 = lVar14 + 1;
          uVar12 = (ulong)(uint)(this->super_EigenDecomposition<float,_1>).kStateCount;
        }
        pfVar13 = this->gCMatrices[eigenIndices[lVar8]];
        for (uVar17 = 0; uVar17 != (~((int)uVar7 >> 0x1f) & uVar7); uVar17 = uVar17 + 1) {
          iVar6 = uVar7 + iVar19;
          for (lVar14 = (long)iVar19; lVar14 != iVar6; lVar14 = lVar14 + 1) {
            pfVar3 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
            auVar21 = ZEXT816(0) << 0x40;
            pfVar18 = pfVar13;
            for (lVar15 = 0; lVar15 < (int)uVar11 / 4 << 2; lVar15 = lVar15 + 4) {
              pfVar18 = pfVar18 + 4;
              auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)pfVar13[lVar15]),
                                        ZEXT416((uint)pfVar3[lVar15]));
              auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)pfVar13[lVar15 + 1]),
                                        ZEXT416((uint)pfVar3[lVar15 + 1]));
              auVar21 = vfmadd132ss_fma(ZEXT416((uint)pfVar13[lVar15 + 2]),auVar21,
                                        ZEXT416((uint)pfVar3[lVar15 + 2]));
              auVar21 = vfmadd132ss_fma(ZEXT416((uint)pfVar13[lVar15 + 3]),auVar21,
                                        ZEXT416((uint)pfVar3[lVar15 + 3]));
            }
            for (; lVar15 < lVar5; lVar15 = lVar15 + 1) {
              fVar1 = *pfVar18;
              pfVar18 = pfVar18 + 1;
              auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)fVar1),ZEXT416((uint)pfVar3[lVar15]));
            }
            auVar21 = vmaxss_avx(auVar21,ZEXT816(0) << 0x40);
            pfVar13 = pfVar13 + lVar5;
            pfVar2[lVar14] = auVar21._0_4_;
          }
          pfVar2[iVar6] = 1.0;
          iVar19 = iVar6 + 1;
        }
      }
    }
  }
  else {
    uVar9 = (ulong)(uint)(~(count >> 0x1f) & count);
    if (secondDerivativeIndices == (int *)0x0) {
      for (uVar16 = 0; uVar16 != uVar9; uVar16 = uVar16 + 1) {
        iVar19 = 0;
        pfVar2 = transitionMatrices[probabilityIndices[uVar16]];
        pfVar13 = transitionMatrices[firstDerivativeIndices[uVar16]];
        for (lVar8 = 0; lVar8 < (this->super_EigenDecomposition<float,_1>).kCategoryCount;
            lVar8 = lVar8 + 1) {
          for (lVar14 = 0; uVar11 = (uint)uVar12, lVar14 < (int)uVar11; lVar14 = lVar14 + 1) {
            fVar1 = (this->super_EigenDecomposition<float,_1>).gEigenValues[eigenIndices[lVar8]]
                    [lVar14];
            dVar20 = exp((double)(fVar1 * (float)edgeLengths[uVar16]));
            (this->super_EigenDecomposition<float,_1>).matrixTmp[lVar14] = (float)dVar20;
            (this->super_EigenDecomposition<float,_1>).firstDerivTmp[lVar14] = (float)dVar20 * fVar1
            ;
            uVar12 = (ulong)(uint)(this->super_EigenDecomposition<float,_1>).kStateCount;
          }
          iVar6 = 0;
          for (uVar7 = 0; uVar7 != (~((int)uVar11 >> 0x1f) & uVar11); uVar7 = uVar7 + 1) {
            lVar5 = (long)(int)(uVar11 + iVar19);
            for (lVar14 = (long)iVar19; lVar14 != lVar5; lVar14 = lVar14 + 1) {
              auVar21 = ZEXT816(0) << 0x40;
              auVar22 = ZEXT816(0) << 0x40;
              for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
                auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)this->gCMatrices
                                                                [eigenIndices[lVar8]]
                                                                [(long)iVar6 + uVar10]),
                                          ZEXT416((uint)(this->super_EigenDecomposition<float,_1>).
                                                        matrixTmp[uVar10]));
                auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)this->gCMatrices
                                                                [eigenIndices[lVar8]]
                                                                [(long)iVar6 + uVar10]),
                                          ZEXT416((uint)(this->super_EigenDecomposition<float,_1>).
                                                        firstDerivTmp[uVar10]));
              }
              auVar21 = vmaxss_avx(auVar21,ZEXT816(0) << 0x40);
              iVar6 = iVar6 + uVar11;
              pfVar2[lVar14] = auVar21._0_4_;
              pfVar13[lVar14] = auVar22._0_4_;
            }
            pfVar2[lVar5] = 1.0;
            pfVar13[lVar5] = 0.0;
            iVar19 = uVar11 + iVar19 + 1;
          }
        }
      }
    }
    else {
      for (uVar16 = 0; uVar16 != uVar9; uVar16 = uVar16 + 1) {
        iVar19 = 0;
        pfVar2 = transitionMatrices[probabilityIndices[uVar16]];
        pfVar13 = transitionMatrices[firstDerivativeIndices[uVar16]];
        pfVar3 = transitionMatrices[secondDerivativeIndices[uVar16]];
        for (lVar8 = 0; lVar8 < (this->super_EigenDecomposition<float,_1>).kCategoryCount;
            lVar8 = lVar8 + 1) {
          for (lVar14 = 0; uVar11 = (uint)uVar12, lVar14 < (int)uVar11; lVar14 = lVar14 + 1) {
            fVar1 = (this->super_EigenDecomposition<float,_1>).gEigenValues[eigenIndices[lVar8]]
                    [lVar14];
            dVar20 = exp((double)(fVar1 * (float)edgeLengths[uVar16]));
            (this->super_EigenDecomposition<float,_1>).matrixTmp[lVar14] = (float)dVar20;
            fVar4 = fVar1 * (float)dVar20;
            (this->super_EigenDecomposition<float,_1>).firstDerivTmp[lVar14] = fVar4;
            (this->super_EigenDecomposition<float,_1>).secondDerivTmp[lVar14] = fVar1 * fVar4;
            uVar12 = (ulong)(uint)(this->super_EigenDecomposition<float,_1>).kStateCount;
          }
          iVar6 = 0;
          for (uVar7 = 0; uVar7 != (~((int)uVar11 >> 0x1f) & uVar11); uVar7 = uVar7 + 1) {
            lVar14 = (long)(int)(uVar11 + iVar19);
            for (lVar5 = (long)iVar19; lVar5 != lVar14; lVar5 = lVar5 + 1) {
              auVar21 = ZEXT816(0) << 0x40;
              auVar22 = ZEXT816(0) << 0x40;
              auVar23 = ZEXT816(0) << 0x40;
              uVar10 = 0;
              while( true ) {
                if (uVar12 == uVar10) break;
                fVar1 = this->gCMatrices[eigenIndices[lVar8]][(long)iVar6 + uVar10];
                auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)fVar1),
                                          ZEXT416((uint)(this->super_EigenDecomposition<float,_1>).
                                                        matrixTmp[uVar10]));
                auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)fVar1),
                                          ZEXT416((uint)(this->super_EigenDecomposition<float,_1>).
                                                        firstDerivTmp[uVar10]));
                auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)fVar1),
                                          ZEXT416((uint)(this->super_EigenDecomposition<float,_1>).
                                                        secondDerivTmp[uVar10]));
                uVar10 = uVar10 + 1;
              }
              auVar21 = vmaxss_avx(auVar21,ZEXT816(0) << 0x40);
              iVar6 = iVar6 + uVar11;
              pfVar2[lVar5] = auVar21._0_4_;
              pfVar13[lVar5] = auVar22._0_4_;
              pfVar3[lVar5] = auVar23._0_4_;
            }
            pfVar2[lVar14] = 1.0;
            pfVar13[lVar14] = 0.0;
            pfVar3[lVar14] = 0.0;
            iVar19 = uVar11 + iVar19 + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>::updateTransitionMatricesWithModelCategories(int* eigenIndices,
                                                      const int* probabilityIndices,
                                                      const int* firstDerivativeIndices,
                                                      const int* secondDerivativeIndices,
                                                      const double* edgeLengths,
                                                      REALTYPE** transitionMatrices,
                                                      int count) {
#ifdef UNROLL													  
	int stateCountModFour = (kStateCount / 4) * 4;
#endif
													  
	if (firstDerivativeIndices == NULL && secondDerivativeIndices == NULL) {
		for (int u = 0; u < count; u++) {
			REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
			int n = 0;
			for (int l = 0; l < kCategoryCount; l++) {
				
                for (int i = 0; i < kStateCount; i++) {
					matrixTmp[i] = exp(gEigenValues[eigenIndices[l]][i] * ((REALTYPE)edgeLengths[u]));
                }
				
                REALTYPE* tmpCMatrices = gCMatrices[eigenIndices[l]];
				for (int i = 0; i < kStateCount; i++) {
					for (int j = 0; j < kStateCount; j++) {
						REALTYPE sum = 0.0;
#ifdef UNROLL						
						int k = 0;
						for (; k < stateCountModFour; k += 4) {
							sum += tmpCMatrices[k + 0] * matrixTmp[k + 0];
							sum += tmpCMatrices[k + 1] * matrixTmp[k + 1];
							sum += tmpCMatrices[k + 2] * matrixTmp[k + 2];
							sum += tmpCMatrices[k + 3] * matrixTmp[k + 3];
						}
						for (; k < kStateCount; k++) {
							sum += tmpCMatrices[k] * matrixTmp[k];
						}
						tmpCMatrices += kStateCount;
#else
						for (int k = 0; k < kStateCount; k++) {
							sum += *tmpCMatrices++ * matrixTmp[k];
						}
#endif						
						if (sum > 0)
							transitionMat[n] = sum;
						else
							transitionMat[n] = 0;
						n++;
					}
if (T_PAD != 0) {
					transitionMat[n] = 1.0;
					n += T_PAD;
}
				}
			}
			
			if (DEBUGGING_OUTPUT) {
                int kMatrixSize = kStateCount * kStateCount;
				fprintf(stderr,"transitionMat index=%d brlen=%.5f\n", probabilityIndices[u], edgeLengths[u]);
				for ( int w = 0; w < (20 > kMatrixSize ? 20 : kMatrixSize); ++w)
					fprintf(stderr,"transitionMat[%d] = %.5f\n", w, transitionMat[w]);
			}
		}
        

	} else if (secondDerivativeIndices == NULL) {
		for (int u = 0; u < count; u++) {
			REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
			REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
			int n = 0;
			for (int l = 0; l < kCategoryCount; l++) {
				
				for (int i = 0; i < kStateCount; i++) {
					REALTYPE scaledEigenValue = gEigenValues[eigenIndices[l]][i];
					matrixTmp[i] = exp(scaledEigenValue * ((REALTYPE)edgeLengths[u]));
					firstDerivTmp[i] = scaledEigenValue * matrixTmp[i];
				}
				
				int m = 0;
				for (int i = 0; i < kStateCount; i++) {
					for (int j = 0; j < kStateCount; j++) {
						REALTYPE sum = 0.0;
						REALTYPE sumD1 = 0.0;
						for (int k = 0; k < kStateCount; k++) {
							sum += gCMatrices[eigenIndices[l]][m] * matrixTmp[k];
							sumD1 += gCMatrices[eigenIndices[l]][m] * firstDerivTmp[k];
							m++;
						}
						if (sum > 0)
							transitionMat[n] = sum;
						else
							transitionMat[n] = 0;
						firstDerivMat[n] = sumD1;
						n++;
					}
if (T_PAD != 0) {
					transitionMat[n] = 1.0;
                    firstDerivMat[n] = 0.0;
					n += T_PAD;
}
				}
			}
		}
	} else {		
		for (int u = 0; u < count; u++) {
			REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
			REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
			REALTYPE* secondDerivMat = transitionMatrices[secondDerivativeIndices[u]];
			int n = 0;
			for (int l = 0; l < kCategoryCount; l++) {
				
				for (int i = 0; i < kStateCount; i++) {
					REALTYPE scaledEigenValue = gEigenValues[eigenIndices[l]][i];
					matrixTmp[i] = exp(scaledEigenValue * ((REALTYPE)edgeLengths[u]));
					firstDerivTmp[i] = scaledEigenValue * matrixTmp[i];
					secondDerivTmp[i] = scaledEigenValue * firstDerivTmp[i];
				}
				
				int m = 0;
				for (int i = 0; i < kStateCount; i++) {
					for (int j = 0; j < kStateCount; j++) {
						REALTYPE sum = 0.0;
						REALTYPE sumD1 = 0.0;
						REALTYPE sumD2 = 0.0;
						for (int k = 0; k < kStateCount; k++) {
							sum += gCMatrices[eigenIndices[l]][m] * matrixTmp[k];
							sumD1 += gCMatrices[eigenIndices[l]][m] * firstDerivTmp[k];
							sumD2 += gCMatrices[eigenIndices[l]][m] * secondDerivTmp[k];
							m++;
						}
						if (sum > 0)
							transitionMat[n] = sum;
						else
							transitionMat[n] = 0;
						firstDerivMat[n] = sumD1;
						secondDerivMat[n] = sumD2;
						n++;
					}
if (T_PAD != 0) {
					transitionMat[n] = 1.0;
                    firstDerivMat[n] = 0.0;
                    secondDerivMat[n] = 0.0;
					n += T_PAD;
}
				}
			}
		}
	}
}